

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int buffer_append(Buffer *buffer,void *_data,size_t len)

{
  BufferBlock *pBVar1;
  int iVar2;
  ulong __n;
  BufferBlock **ppBVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = 1;
  if (len != 0) {
    uVar5 = buffer->block_size;
    pBVar1 = buffer->tail;
    if (pBVar1 != (BufferBlock *)0x0) {
      uVar4 = pBVar1->bytes;
      if (uVar4 < uVar5) {
        __n = 0;
        if (uVar4 <= uVar5) {
          __n = uVar5 - uVar4;
        }
        if (len <= __n) {
          __n = len;
        }
        memcpy(pBVar1->data + uVar4,_data,__n);
        uVar4 = buffer->tail->bytes + __n;
        buffer->tail->bytes = uVar4;
        buffer->total_bytes = buffer->total_bytes + __n;
        if (uVar5 < uVar4) {
          __assert_fail("buffer->tail->bytes <= blocksize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                        ,0x301,"int buffer_append(Buffer *, const void *, size_t)");
        }
        len = len - __n;
        if (len == 0) {
          return 1;
        }
        _data = (void *)((long)_data + __n);
      }
      if (uVar4 < uVar5) {
        __assert_fail("(!buffer->tail) || (buffer->tail->bytes >= blocksize)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x307,"int buffer_append(Buffer *, const void *, size_t)");
      }
    }
    if (uVar5 < len) {
      uVar5 = len;
    }
    pBVar1 = (BufferBlock *)(*buffer->m)((int)uVar5 + 0x18,buffer->d);
    if (pBVar1 == (BufferBlock *)0x0) {
      iVar2 = 0;
    }
    else {
      pBVar1->data = (uint8 *)(pBVar1 + 1);
      pBVar1->bytes = len;
      pBVar1->next = (BufferBlock *)0x0;
      ppBVar3 = &buffer->tail->next;
      if (buffer->tail == (BufferBlock *)0x0) {
        ppBVar3 = &buffer->head;
      }
      *ppBVar3 = pBVar1;
      buffer->tail = pBVar1;
      memcpy(pBVar1 + 1,_data,len);
      buffer->total_bytes = buffer->total_bytes + len;
    }
  }
  return iVar2;
}

Assistant:

int buffer_append(Buffer *buffer, const void *_data, size_t len)
{
    const uint8 *data = (const uint8 *) _data;

    // note that we make the blocks bigger than blocksize when we have enough
    //  data to overfill a fresh block, to reduce allocations.
    const size_t blocksize = buffer->block_size;

    if (len == 0)
        return 1;

    if (buffer->tail != NULL)
    {
        const size_t tailbytes = buffer->tail->bytes;
        const size_t avail = (tailbytes >= blocksize) ? 0 : blocksize - tailbytes;
        const size_t cpy = (avail > len) ? len : avail;
        if (cpy > 0)
        {
            memcpy(buffer->tail->data + tailbytes, data, cpy);
            len -= cpy;
            data += cpy;
            buffer->tail->bytes += cpy;
            buffer->total_bytes += cpy;
            assert(buffer->tail->bytes <= blocksize);
        } // if
    } // if

    if (len > 0)
    {
        assert((!buffer->tail) || (buffer->tail->bytes >= blocksize));
        const size_t bytecount = len > blocksize ? len : blocksize;
        const size_t malloc_len = sizeof (BufferBlock) + bytecount;
        BufferBlock *item = (BufferBlock *) buffer->m(malloc_len, buffer->d);
        if (item == NULL)
            return 0;

        item->data = ((uint8 *) item) + sizeof (BufferBlock);
        item->bytes = len;
        item->next = NULL;
        if (buffer->tail != NULL)
            buffer->tail->next = item;
        else
            buffer->head = item;
        buffer->tail = item;

        memcpy(item->data, data, len);
        buffer->total_bytes += len;
    } // if

    return 1;
}